

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

NULLCRef *
NULLCTypeInfo::MemberByName(NULLCRef *__return_storage_ptr__,NULLCRef obj,NULLCArray member)

{
  uint uVar1;
  int iVar2;
  ExternTypeInfo *pEVar3;
  char *pcVar4;
  size_t sVar5;
  uint member_00;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x5a,"NULLCRef NULLCTypeInfo::MemberByName(NULLCRef, NULLCArray)");
  }
  pEVar3 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),obj.typeID);
  if (pEVar3->subCat == CAT_CLASS) {
    pcVar4 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar3->offsetToName);
    sVar5 = strlen(pcVar4);
    pcVar4 = pcVar4 + sVar5;
    uVar1 = (pEVar3->field_8).arrSize;
    for (member_00 = 0; pcVar4 = pcVar4 + 1, uVar1 != member_00; member_00 = member_00 + 1) {
      iVar2 = strcmp(pcVar4,member.ptr);
      if (iVar2 == 0) {
        MemberByIndex(__return_storage_ptr__,obj,member_00);
        return __return_storage_ptr__;
      }
      sVar5 = strlen(pcVar4);
      pcVar4 = pcVar4 + sVar5;
    }
  }
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef MemberByName(NULLCRef obj, NULLCArray member)
	{
		assert(linker);
		ExternTypeInfo &exType = linker->exTypes[obj.typeID];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
			return NULLCRef();
		const char *str = &linker->exSymbols[exType.offsetToName];
		const char *memberName = str + strlen(str) + 1;
		for(unsigned i = 0; i < exType.memberCount; i++)
		{
			if(strcmp(memberName, member.ptr) == 0)
				return MemberByIndex(obj, i);
			memberName += strlen(memberName) + 1;
		}
		return NULLCRef();
	}